

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O2

ssize_t __thiscall
libnbt::NBTTagVector<libnbt::NBTBase_*>::read
          (NBTTagVector<libnbt::NBTBase_*> *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_var;
  ssize_t extraout_RAX;
  int i;
  undefined4 in_register_00000034;
  int32_t size;
  NBTBase *temp;
  ssize_t sVar2;
  
  size = 0;
  readBytes((istream *)CONCAT44(in_register_00000034,__fd),(char *)&size,'\x04');
  iVar1 = (*(this->super_NBTBase)._vptr_NBTBase[8])(this);
  sVar2 = CONCAT44(extraout_var,iVar1);
  for (iVar1 = 0; iVar1 < size; iVar1 = iVar1 + 1) {
    readBytes((istream *)CONCAT44(in_register_00000034,__fd),(char *)&temp,
              NBTTagVector<libnbt::NBTBase*>::width);
    std::vector<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>::push_back
              (&this->array,&temp);
    sVar2 = extraout_RAX;
  }
  return sVar2;
}

Assistant:

void NBTTagVector<T>::read(std::istream &in) {
        int32_t size = 0;
        readBytes(in, (char *) &size, 4);
        clear();
        for (int i = 0; i < size; i++) {
            T temp;
            readBytes(in, (char *) &temp, width);
            array.push_back(temp);
        }
    }